

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O3

int RqOutAddIds(RqOutWorkMem *pOutWorkMem,int32_t nOutSymIdBeg,int32_t nOutSymIdAdd)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (pOutWorkMem->nESI_max < pOutWorkMem->nESI + nOutSymIdAdd) {
    fprintf(_stderr,"Error:%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c",
            0x10e,"Maximum number of ESIs reached.");
    nOutSymIdAdd = pOutWorkMem->nESI_max - pOutWorkMem->nESI;
    iVar2 = -3;
  }
  if (0 < nOutSymIdAdd) {
    do {
      iVar1 = pOutWorkMem->nESI;
      pOutWorkMem->nESI = iVar1 + 1;
      (&pOutWorkMem[1].params.K)[iVar1] = nOutSymIdBeg;
      nOutSymIdBeg = nOutSymIdBeg + 1;
      nOutSymIdAdd = nOutSymIdAdd + -1;
    } while (nOutSymIdAdd != 0);
  }
  return iVar2;
}

Assistant:

int RqOutAddIds(RqOutWorkMem* pOutWorkMem,
		int32_t nOutSymIdBeg,
		int32_t nOutSymIdAdd)
{
	int ret = 0;
	if (pOutWorkMem->nESI + nOutSymIdAdd > pOutWorkMem->nESI_max) {
		errmsg("Maximum number of ESIs reached.");

		nOutSymIdAdd = pOutWorkMem->nESI_max - pOutWorkMem->nESI;
		ret = RQ_ERR_MAX_IDS_REACHED;
	}

	for (int i = 0; i < nOutSymIdAdd; ++i) {
		pOutWorkMem->ESIs[pOutWorkMem->nESI++] = nOutSymIdBeg + i;
	}

	return ret;
}